

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O0

bool tchecker::refdbm::has_fixed_value(db_t *rdbm,reference_clock_variables_t *r,clock_id_t x)

{
  bool bVar1;
  int iVar2;
  clock_id_t cVar3;
  ineq_cmp_t iVar4;
  integer_t iVar5;
  integer_t iVar6;
  size_t sVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  const_reference pvVar8;
  bool local_39;
  value_type local_38;
  clock_id_t rx;
  clock_id_t rdim;
  clock_id_t x_local;
  reference_clock_variables_t *r_local;
  db_t *rdbm_local;
  
  if (rdbm == (db_t *)0x0) {
    __assert_fail("rdbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x390,
                  "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
                 );
  }
  bVar1 = is_consistent(rdbm,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x391,
                  "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
                 );
  }
  bVar1 = is_tight(rdbm,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x392,
                  "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
                 );
  }
  sVar7 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)r);
  if (x < sVar7) {
    sVar7 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)r);
    iVar2 = (int)sVar7;
    cVar3 = reference_clock_variables_t::refcount(r);
    if (x < cVar3) {
      local_38 = 0;
    }
    else {
      this = reference_clock_variables_t::refmap(r);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,(ulong)x);
      local_38 = *pvVar8;
    }
    iVar4 = tchecker::dbm::comparator(rdbm + (x * iVar2 + local_38));
    local_39 = false;
    if (iVar4 == LE) {
      iVar4 = tchecker::dbm::comparator(rdbm + (local_38 * iVar2 + x));
      local_39 = false;
      if (iVar4 == LE) {
        iVar5 = tchecker::dbm::value(rdbm + (local_38 * iVar2 + x));
        iVar6 = tchecker::dbm::value(rdbm + (x * iVar2 + local_38));
        local_39 = iVar5 == -iVar6;
      }
    }
    return local_39;
  }
  __assert_fail("x < r.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                ,0x393,
                "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
               );
}

Assistant:

bool has_fixed_value(tchecker::dbm::db_t const * rdbm, tchecker::reference_clock_variables_t const & r, tchecker::clock_id_t x)
{
  assert(rdbm != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));
  assert(x < r.size());

  tchecker::clock_id_t const rdim = r.size();
  tchecker::clock_id_t const rx = (x < r.refcount() ? 0 : r.refmap()[x]);

  return (tchecker::dbm::comparator(RDBM(x, rx)) == tchecker::LE) && (tchecker::dbm::comparator(RDBM(rx, x)) == tchecker::LE) &&
         (tchecker::dbm::value(RDBM(rx, x)) == -tchecker::dbm::value(RDBM(x, rx)));
}